

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_bitset.hpp
# Opt level: O1

basic_ostream<char,_std::char_traits<char>_> *
boost::operator<<(basic_ostream<char,_std::char_traits<char>_> *os,
                 dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *b)

{
  basic_ostream<char,_std::char_traits<char>_> *pbVar1;
  long *plVar2;
  ulong uVar3;
  bool bVar4;
  ctype cVar5;
  ctype cVar6;
  ctype cVar7;
  basic_ostream<char,_std::char_traits<char>_> bVar8;
  bool bVar9;
  uint uVar10;
  ctype *pcVar11;
  ulong uVar12;
  size_type pos;
  ulong uVar13;
  long lVar14;
  sentry cerberos;
  locale local_48 [8];
  sentry local_40 [16];
  
  std::ostream::sentry::sentry(local_40,(ostream *)os);
  bVar4 = false;
  if (local_40[0] == (sentry)0x1) {
    std::locale::locale(local_48,(locale *)(os + *(long *)(*(long *)os + -0x18) + 0xd0));
    pcVar11 = std::use_facet<std::ctype<char>>(local_48);
    std::locale::~locale(local_48);
    if (pcVar11[0x38] == (ctype)0x0) {
      std::ctype<char>::_M_widen_init();
      cVar6 = (ctype)(**(code **)(*(long *)pcVar11 + 0x30))(pcVar11,0x30);
    }
    else {
      cVar6 = pcVar11[0x69];
    }
    if (pcVar11[0x38] == (ctype)0x0) {
      std::ctype<char>::_M_widen_init();
      cVar7 = (ctype)(**(code **)(*(long *)pcVar11 + 0x30))(pcVar11,0x31);
    }
    else {
      cVar7 = pcVar11[0x6a];
    }
    lVar14 = *(long *)(*(long *)os + -0x18);
    pbVar1 = os + lVar14;
    uVar12 = *(ulong *)(os + lVar14 + 0x10);
    if ((long)*(ulong *)(os + lVar14 + 0x10) < 1) {
      uVar12 = 0;
    }
    plVar2 = *(long **)(os + lVar14 + 0xe8);
    uVar3 = b->m_num_bits;
    uVar13 = uVar12 - uVar3;
    if (uVar12 < uVar3) {
      uVar13 = 0;
    }
    if (os[lVar14 + 0xe1] == (basic_ostream<char,_std::char_traits<char>_>)0x0) {
      bVar8 = (basic_ostream<char,_std::char_traits<char>_>)std::ios::widen((char)pbVar1);
      pbVar1[0xe0] = bVar8;
      pbVar1[0xe1] = (basic_ostream<char,_std::char_traits<char>_>)0x1;
    }
    bVar4 = false;
    bVar8 = pbVar1[0xe0];
    bVar9 = true;
    if ((uVar3 < uVar12) && ((*(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) & 0xb0) != 0x20)
       ) {
      do {
        if ((basic_ostream<char,_std::char_traits<char>_> *)plVar2[5] <
            (basic_ostream<char,_std::char_traits<char>_> *)plVar2[6]) {
          *(basic_ostream<char,_std::char_traits<char>_> *)plVar2[5] = bVar8;
          plVar2[5] = plVar2[5] + 1;
          uVar10 = (uint)(byte)bVar8;
        }
        else {
          uVar10 = (**(code **)(*plVar2 + 0x68))(plVar2,bVar8);
        }
        bVar9 = uVar10 != 0xffffffff;
        if (uVar10 == 0xffffffff) {
          bVar4 = true;
          goto LAB_00125a3a;
        }
        bVar4 = 1 < (long)uVar13;
        uVar13 = uVar13 - 1;
      } while (bVar4);
      bVar4 = false;
      uVar13 = 0;
    }
LAB_00125a3a:
    if (bVar9) {
      pos = b->m_num_bits;
      do {
        pos = pos - 1;
        if (pos == 0xffffffffffffffff) goto LAB_00125aad;
        bVar9 = dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::test(b,pos);
        cVar5 = cVar7;
        if (!bVar9) {
          cVar5 = cVar6;
        }
        uVar10 = (uint)(byte)cVar5;
        if ((ctype *)plVar2[5] < (ctype *)plVar2[6]) {
          *(ctype *)plVar2[5] = cVar5;
          plVar2[5] = plVar2[5] + 1;
        }
        else {
          uVar10 = (**(code **)(*plVar2 + 0x68))(plVar2,uVar10);
        }
      } while (uVar10 != 0xffffffff);
      bVar4 = true;
    }
LAB_00125aad:
    if ((!bVar4) && (0 < (long)uVar13)) {
      lVar14 = uVar13 + 1;
      do {
        if ((basic_ostream<char,_std::char_traits<char>_> *)plVar2[5] <
            (basic_ostream<char,_std::char_traits<char>_> *)plVar2[6]) {
          *(basic_ostream<char,_std::char_traits<char>_> *)plVar2[5] = bVar8;
          plVar2[5] = plVar2[5] + 1;
          uVar10 = (uint)(byte)bVar8;
        }
        else {
          uVar10 = (**(code **)(*plVar2 + 0x68))(plVar2,bVar8);
        }
        if (uVar10 == 0xffffffff) {
          bVar4 = true;
          break;
        }
        lVar14 = lVar14 + -1;
      } while (1 < lVar14);
    }
    *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = 0;
  }
  if (bVar4) {
    std::ios::clear((int)*(undefined8 *)(*(long *)os + -0x18) + (int)os);
  }
  std::ostream::sentry::~sentry(local_40);
  return os;
}

Assistant:

std::basic_ostream<Ch, Tr>&
operator<<(std::basic_ostream<Ch, Tr>& os,
           const dynamic_bitset<Block, Alloc>& b)
{

    using namespace std;

    const ios_base::iostate ok = ios_base::goodbit;
    ios_base::iostate err = ok;

    typename basic_ostream<Ch, Tr>::sentry cerberos(os);
    if (cerberos) {

        BOOST_DYNAMIC_BITSET_CTYPE_FACET(Ch, fac, os.getloc());
        const Ch zero = BOOST_DYNAMIC_BITSET_WIDEN_CHAR(fac, '0');
        const Ch one  = BOOST_DYNAMIC_BITSET_WIDEN_CHAR(fac, '1');

        BOOST_TRY {

            typedef typename dynamic_bitset<Block, Alloc>::size_type bitset_size_type;
            typedef basic_streambuf<Ch, Tr> buffer_type;

            buffer_type * buf = os.rdbuf();
            // careful: os.width() is signed (and can be < 0)
            const bitset_size_type width = (os.width() <= 0) ? 0 : static_cast<bitset_size_type>(os.width());
            streamsize npad = (width <= b.size()) ? 0 : width - b.size();

            const Ch fill_char = os.fill();
            const ios_base::fmtflags adjustfield = os.flags() & ios_base::adjustfield;

            // if needed fill at left; pad is decreased along the way
            if (adjustfield != ios_base::left) {
                for (; 0 < npad; --npad)
                    if (Tr::eq_int_type(Tr::eof(), buf->sputc(fill_char))) {
                          err |= ios_base::failbit;
                          break;
                    }
            }

            if (err == ok) {
                // output the bitset
                for (bitset_size_type i = b.size(); 0 < i; --i) {
                    typename buffer_type::int_type
                        ret = buf->sputc(b.test(i-1)? one : zero);
                    if (Tr::eq_int_type(Tr::eof(), ret)) {
                        err |= ios_base::failbit;
                        break;
                    }
                }
            }

            if (err == ok) {
                // if needed fill at right
                for (; 0 < npad; --npad) {
                    if (Tr::eq_int_type(Tr::eof(), buf->sputc(fill_char))) {
                        err |= ios_base::failbit;
                        break;
                    }
                }
            }


            os.width(0);

        } BOOST_CATCH (...) { // see std 27.6.1.1/4
            bool rethrow = false;
            BOOST_TRY { os.setstate(ios_base::failbit); } BOOST_CATCH (...) { rethrow = true; } BOOST_CATCH_END

            if (rethrow)
                BOOST_RETHROW;
        }